

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void TR_ARITH(ast *node,C_OP *place)

{
  bool bVar1;
  int k;
  ast *a2;
  IrSim *this;
  ast *in_RDI;
  Operand t2;
  Operand t1;
  Operand label2;
  Operand label1;
  int type;
  C_IC *in_stack_fffffffffffffbe8;
  IrSim *in_stack_fffffffffffffbf0;
  IrSim *in_stack_fffffffffffffbf8;
  IrSim *a1;
  C_OP *in_stack_fffffffffffffc08;
  ast *in_stack_fffffffffffffc10;
  IrSim *in_stack_fffffffffffffc18;
  IrSim *in_stack_fffffffffffffc58;
  C_OP *in_stack_ffffffffffffff90;
  C_OP *in_stack_ffffffffffffff98;
  ast *in_stack_ffffffffffffffa0;
  
  k = IrSim::ast2ic(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
  bVar1 = IrSim::isGoto(&irSim,k);
  if (bVar1) {
    IrSim::newLabel(in_stack_fffffffffffffc58);
    IrSim::newLabel(in_stack_fffffffffffffc58);
    IrSim::icAssign(in_stack_fffffffffffffbf8,(C_OP *)in_stack_fffffffffffffbf0,
                    (C_OP *)in_stack_fffffffffffffbe8);
    IrSim::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffffbf0);
    TR_Cond(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    IrSim::icLabel(in_stack_fffffffffffffbf8,(C_OP *)in_stack_fffffffffffffbf0);
    IrSim::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    IrSim::icAssign(in_stack_fffffffffffffbf8,(C_OP *)in_stack_fffffffffffffbf0,
                    (C_OP *)in_stack_fffffffffffffbe8);
    IrSim::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    IrSim::icLabel(in_stack_fffffffffffffbf8,(C_OP *)in_stack_fffffffffffffbf0);
    IrSim::operator<<(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffffbf0);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffffbf0);
    InterCode::~InterCode((InterCode *)in_stack_fffffffffffffbf0);
    Operand::~Operand((Operand *)0x11367f);
    Operand::~Operand((Operand *)0x11368c);
  }
  else {
    a1 = &irSim;
    IrSim::newTmpVar(in_stack_fffffffffffffc58);
    IrSim::newTmpVar(in_stack_fffffffffffffc58);
    a2 = sibling(in_RDI,-1);
    TR_Exp(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    this = (IrSim *)sibling(in_RDI,1);
    TR_Exp(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    IrSim::icArith(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                   (C_OP *)a1,(C_OP *)a2);
    IrSim::operator<<(this,in_stack_fffffffffffffbe8);
    InterCode::~InterCode((InterCode *)this);
    Operand::~Operand((Operand *)0x113850);
    Operand::~Operand((Operand *)0x11385d);
  }
  return;
}

Assistant:

static void TR_ARITH(ast *node, C_OP &place) {
    int type = irSim.ast2ic(node);
    if (irSim.isGoto(type)) {
        Operand label1 = irSim.newLabel(), label2 = irSim.newLabel();
        irSim << irSim.icAssign(place, OP_ZERO);
        TR_Cond(node, label1, label2);
        irSim << irSim.icLabel(label1) << irSim.icAssign(place, OP_ONE) << irSim.icLabel(label2);
        return;
    }
    Operand t1 = irSim.newTmpVar(), t2 = irSim.newTmpVar();
    TR_Exp(sibling(node, -1), t1);
    TR_Exp(sibling(node, 1), t2);
    irSim << irSim.icArith(node, place, t1, t2);
}